

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ulong __thiscall smf::MidiFile::unpackVLV(MidiFile *this,uchar a,uchar b,uchar c,uchar d,uchar e)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  uchar bytes [5];
  
  bytes[0] = a;
  bytes[1] = b;
  bytes[2] = c;
  bytes[3] = d;
  bytes[4] = e;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 5) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"VLV number is too large");
      std::endl<char,std::char_traits<char>>(poVar1);
      this->m_rwstatus = false;
      return 0;
    }
    if (-1 < (char)bytes[lVar3]) break;
    lVar3 = lVar3 + 1;
  }
  uVar2 = 0;
  for (lVar4 = -1; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    uVar2 = uVar2 << 7 | (ulong)(bytes[lVar4 + 1] & 0x7f);
  }
  return uVar2;
}

Assistant:

ulong MidiFile::unpackVLV(uchar a, uchar b, uchar c, uchar d, uchar e) {
	uchar bytes[5] = {a, b, c, d, e};
	int count = 0;
	while ((count < 5) && (bytes[count] > 0x7f)) {
		count++;
	}
	count++;
	if (count >= 6) {
		std::cerr << "VLV number is too large" << std::endl;
		m_rwstatus = false;
		return 0;
	}

	ulong output = 0;
	for (int i=0; i<count; i++) {
		output = output << 7;
		output = output | (bytes[i] & 0x7f);
	}

	return output;
}